

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_or(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  TCGv_i64 t;
  TCGv_i64 t0;
  int prio;
  int rb;
  int ra;
  int rs;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rS(ctx->opcode);
  uVar2 = rA(ctx->opcode);
  uVar3 = rB(ctx->opcode);
  if ((uVar1 == uVar2) && (uVar1 == uVar3)) {
    uVar2 = Rc(ctx->opcode);
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        t0._0_4_ = 0;
        switch(uVar1) {
        case 1:
          t0._0_4_ = 2;
          break;
        case 2:
          t0._0_4_ = 4;
          break;
        case 3:
          if ((ctx->pr & 1U) == 0) {
            t0._0_4_ = 6;
          }
          break;
        default:
          break;
        case 5:
          if ((ctx->pr & 1U) == 0) {
            t0._0_4_ = 5;
          }
          break;
        case 6:
          t0._0_4_ = 3;
          break;
        case 7:
          if (((ctx->hv & 1U) != 0) && ((ctx->pr & 1U) == 0)) {
            t0._0_4_ = 7;
          }
          break;
        case 0x1f:
          t0._0_4_ = (uint)((ctx->pr & 1U) == 0);
        }
        if ((uint)t0 != 0) {
          t = tcg_temp_new_i64(tcg_ctx_00);
          gen_load_spr(tcg_ctx_00,t,0x380);
          tcg_gen_andi_i64_ppc64(tcg_ctx_00,t,t,-0x1c000000000001);
          tcg_gen_ori_i64_ppc64(tcg_ctx_00,t,t,(long)(int)(uint)t0 << 0x32);
          gen_store_spr(tcg_ctx_00,0x380,t);
          tcg_temp_free_i64(tcg_ctx_00,t);
        }
        gen_pause(ctx);
      }
    }
    else {
      gen_set_Rc0(ctx,cpu_gpr[(int)uVar1]);
    }
  }
  else {
    if (uVar1 == uVar3) {
      tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_gpr[(int)uVar2],cpu_gpr[(int)uVar1]);
    }
    else {
      tcg_gen_or_i64_ppc64(tcg_ctx_00,cpu_gpr[(int)uVar2],cpu_gpr[(int)uVar1],cpu_gpr[(int)uVar3]);
    }
    uVar1 = Rc(ctx->opcode);
    if (uVar1 != 0) {
      gen_set_Rc0(ctx,cpu_gpr[(int)uVar2]);
    }
  }
  return;
}

Assistant:

static void gen_or(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs, ra, rb;

    rs = rS(ctx->opcode);
    ra = rA(ctx->opcode);
    rb = rB(ctx->opcode);
    /* Optimisation for mr. ri case */
    if (rs != ra || rs != rb) {
        if (rs != rb) {
            tcg_gen_or_tl(tcg_ctx, cpu_gpr[ra], cpu_gpr[rs], cpu_gpr[rb]);
        } else {
            tcg_gen_mov_tl(tcg_ctx, cpu_gpr[ra], cpu_gpr[rs]);
        }
        if (unlikely(Rc(ctx->opcode) != 0)) {
            gen_set_Rc0(ctx, cpu_gpr[ra]);
        }
    } else if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rs]);
#if defined(TARGET_PPC64)
    } else if (rs != 0) { /* 0 is nop */
        int prio = 0;

        switch (rs) {
        case 1:
            /* Set process priority to low */
            prio = 2;
            break;
        case 6:
            /* Set process priority to medium-low */
            prio = 3;
            break;
        case 2:
            /* Set process priority to normal */
            prio = 4;
            break;
        case 31:
            if (!ctx->pr) {
                /* Set process priority to very low */
                prio = 1;
            }
            break;
        case 5:
            if (!ctx->pr) {
                /* Set process priority to medium-hight */
                prio = 5;
            }
            break;
        case 3:
            if (!ctx->pr) {
                /* Set process priority to high */
                prio = 6;
            }
            break;
        case 7:
            if (ctx->hv && !ctx->pr) {
                /* Set process priority to very high */
                prio = 7;
            }
            break;
        default:
            break;
        }
        if (prio) {
            TCGv t0 = tcg_temp_new(tcg_ctx);
            gen_load_spr(tcg_ctx, t0, SPR_PPR);
            tcg_gen_andi_tl(tcg_ctx, t0, t0, ~0x001C000000000000ULL);
            tcg_gen_ori_tl(tcg_ctx, t0, t0, ((uint64_t)prio) << 50);
            gen_store_spr(tcg_ctx, SPR_PPR, t0);
            tcg_temp_free(tcg_ctx, t0);
        }
        /*
         * Pause out of TCG otherwise spin loops with smt_low eat too
         * much CPU and the kernel hangs.  This applies to all
         * encodings other than no-op, e.g., miso(rs=26), yield(27),
         * mdoio(29), mdoom(30), and all currently undefined.
         */
        gen_pause(ctx);
#endif
    }
}